

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDD.cpp
# Opt level: O3

bool __thiscall
HDD::Copy(HDD *this,HDD *phSrc_,int64_t uSectors_,int64_t uSrcOffset_,int64_t uDstOffset_,
         int64_t uTotal_,char *pcszAction_)

{
  long lVar1;
  uint8_t *pv_;
  long lVar2;
  int64_t uPos;
  long lVar3;
  int iVar4;
  int iVar5;
  char *local_68;
  char *local_60;
  int64_t local_58;
  int64_t local_50;
  int64_t local_48;
  char *local_40;
  ulong local_38;
  
  local_58 = uSrcOffset_;
  local_48 = uDstOffset_;
  pv_ = AllocMem(this->sector_size << 0xb);
  if (uTotal_ == 0) {
    uTotal_ = uSectors_;
  }
  local_40 = "Copying";
  if (pcszAction_ != (char *)0x0) {
    local_40 = pcszAction_;
  }
  lVar3 = 0;
  local_50 = uSectors_;
  local_38 = uTotal_;
  while( true ) {
    if (phSrc_ != (HDD *)0x0) {
      lseek64(phSrc_->h,(long)phSrc_->data_offset + (long)phSrc_->sector_size * (local_58 + lVar3),0
             );
    }
    lseek64(this->h,(long)this->data_offset + (long)this->sector_size * (local_48 + lVar3),0);
    if (uSectors_ <= lVar3) {
      lVar3 = uSectors_;
    }
    iVar4 = (int)uSectors_ - (int)lVar3;
    iVar5 = iVar4;
    if (0x7ff < iVar4) {
      iVar5 = 0x800;
    }
    local_60 = local_40;
    lVar1 = local_48 + lVar3;
    local_68 = (char *)CONCAT44(local_68._4_4_,(int)((ulong)(lVar1 * 100) / local_38));
    Message<char_const*,int>(msgStatus,"%s... %d%%",&local_60,(int *)&local_68);
    if (iVar4 == 0) break;
    if (phSrc_ != (HDD *)0x0) {
      lVar2 = read(phSrc_->h,pv_,(ulong)(uint)(phSrc_->sector_size * iVar5));
      if (lVar2 < 1) {
        lVar2 = 0;
      }
      iVar4 = (int)(lVar2 / (long)phSrc_->sector_size);
      if (iVar5 != iVar4) {
        local_60 = (char *)((long)iVar4 + local_58 + lVar3);
        local_68 = LastError();
        Message<long,char_const*>
                  (msgStatus,"Read error at sector %lu: %s",(long *)&local_60,&local_68);
        memset(pv_ + (long)iVar4 * (long)this->sector_size,0,(long)this->sector_size);
        iVar5 = iVar4 + 1;
      }
    }
    if (opt.byteswap != 0) {
      ByteSwap(pv_,(long)iVar5 * (long)this->sector_size);
    }
    lVar2 = write(this->h,pv_,(ulong)(uint)(this->sector_size * iVar5));
    if (lVar2 < 1) {
      lVar2 = 0;
    }
    iVar4 = (int)(lVar2 / (long)this->sector_size);
    uSectors_ = local_50;
    if (iVar5 != iVar4) {
      local_60 = (char *)(iVar4 + lVar1);
      local_68 = LastError();
      uSectors_ = local_50;
      Message<long,char_const*>
                (msgStatus,"Write error at sector %lu: %s",(long *)&local_60,&local_68);
      iVar4 = iVar4 + 1;
    }
    lVar3 = lVar3 + iVar4;
  }
  FreeMem(pv_);
  return true;
}

Assistant:

bool HDD::Copy(HDD* phSrc_, int64_t uSectors_, int64_t uSrcOffset_/*=0*/, int64_t uDstOffset_/*=0*/, int64_t uTotal_/*=0*/, const char* pcszAction_)
{
    MEMORY mem(SECTOR_BLOCK * sector_size);

    if (!uTotal_) uTotal_ = uSectors_;

    for (int64_t uPos = 0;;)
    {
        // Sync source and destinations
        if (phSrc_) phSrc_->Seek(uSrcOffset_ + uPos);
        Seek(uDstOffset_ + uPos);

        // Determine how much to transfer in one go
        if (uPos > uSectors_) uPos = uSectors_;
        auto uBlock = std::min(static_cast<int>(uSectors_ - uPos), SECTOR_BLOCK);

        Message(msgStatus, "%s... %d%%", pcszAction_ ? pcszAction_ : "Copying",
            static_cast<int>((static_cast<uint64_t>(uDstOffset_ + uPos) * 100 / uTotal_)));

        if (!uBlock)
            break;

        // Read from source disk
        auto uRead = phSrc_ ? phSrc_->Read(mem, uBlock) : uBlock;
        if (uRead != uBlock)
        {
            Message(msgStatus, "Read error at sector %lu: %s", uSrcOffset_ + uPos + uRead, LastError());

            // Clear the bad block, but include it in the read data
            memset(mem + (uRead * sector_size), 0, sector_size);
            ++uRead;
        }

        // Forced byte-swapping?
        if (opt.byteswap)
            ByteSwap(mem, uRead * sector_size);

        // Write to target disk
        auto uWritten = Write(mem, uRead);
        if (uWritten != uRead)
        {
            Message(msgStatus, "Write error at sector %lu: %s", uDstOffset_ + uPos + uWritten, LastError());

            // Skip past the write error
            ++uWritten;
        }

        // Advance by the amount written
        uPos += uWritten;
    }

    return true;
}